

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_modp(mbedtls_mpi *N,mbedtls_ecp_group *grp)

{
  int iVar1;
  size_t sVar2;
  mbedtls_mpi *Y;
  
  if (grp->modp == (_func_int_mbedtls_mpi_ptr *)0x0) {
    iVar1 = mbedtls_mpi_mod_mpi(N,N,&grp->P);
    return iVar1;
  }
  if ((N->s < 0) && (iVar1 = mbedtls_mpi_cmp_int(N,0), iVar1 != 0)) {
    return -0x4f80;
  }
  sVar2 = mbedtls_mpi_bitlen(N);
  if (grp->pbits * 2 < sVar2) {
    return -0x4f80;
  }
  iVar1 = (*grp->modp)(N);
  if (iVar1 != 0) {
    return iVar1;
  }
  Y = &grp->P;
  while ((N->s < 0 && (iVar1 = mbedtls_mpi_cmp_int(N,0), iVar1 != 0))) {
    iVar1 = mbedtls_mpi_add_mpi(N,N,Y);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  do {
    iVar1 = mbedtls_mpi_cmp_mpi(N,Y);
    if (iVar1 < 0) {
      return 0;
    }
    iVar1 = mbedtls_mpi_sub_abs(N,N,Y);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

static int ecp_modp( mbedtls_mpi *N, const mbedtls_ecp_group *grp )
{
    int ret;

    if( grp->modp == NULL )
        return( mbedtls_mpi_mod_mpi( N, N, &grp->P ) );

    /* N->s < 0 is a much faster test, which fails only if N is 0 */
    if( ( N->s < 0 && mbedtls_mpi_cmp_int( N, 0 ) != 0 ) ||
        mbedtls_mpi_bitlen( N ) > 2 * grp->pbits )
    {
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    MBEDTLS_MPI_CHK( grp->modp( N ) );

    /* N->s < 0 is a much faster test, which fails only if N is 0 */
    while( N->s < 0 && mbedtls_mpi_cmp_int( N, 0 ) != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &grp->P ) );

    while( mbedtls_mpi_cmp_mpi( N, &grp->P ) >= 0 )
        /* we known P, N and the result are positive */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( N, N, &grp->P ) );

cleanup:
    return( ret );
}